

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QInputMethodQueryEvent::QueryPair>::
emplace<QInputMethodQueryEvent::QueryPair_const&>
          (QMovableArrayOps<QInputMethodQueryEvent::QueryPair> *this,qsizetype i,QueryPair *args)

{
  QueryPair **ppQVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  QueryPair *pQVar4;
  QueryPair *pQVar5;
  long in_FS_OFFSET;
  bool bVar6;
  QueryPair tmp;
  Inserter local_90;
  InputMethodQuery local_68;
  undefined4 uStack_64;
  anon_union_24_3_e3d07ef4_for_data aStack_60;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<QInputMethodQueryEvent::QueryPair>).
           super_QArrayDataPointer<QInputMethodQueryEvent::QueryPair>.d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_002c9c05:
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    aStack_60._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    aStack_60._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    aStack_60.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    _local_68 = CONCAT44(0xaaaaaaaa,args->query);
    ::QVariant::QVariant((QVariant *)&aStack_60,&args->value);
    bVar6 = (this->super_QGenericArrayOps<QInputMethodQueryEvent::QueryPair>).
            super_QArrayDataPointer<QInputMethodQueryEvent::QueryPair>.size != 0;
    QArrayDataPointer<QInputMethodQueryEvent::QueryPair>::detachAndGrow
              ((QArrayDataPointer<QInputMethodQueryEvent::QueryPair> *)this,(uint)(i == 0 && bVar6),
               1,(QueryPair **)0x0,(QArrayDataPointer<QInputMethodQueryEvent::QueryPair> *)0x0);
    if (i == 0 && bVar6) {
      pQVar4 = (this->super_QGenericArrayOps<QInputMethodQueryEvent::QueryPair>).
               super_QArrayDataPointer<QInputMethodQueryEvent::QueryPair>.ptr;
      pQVar4[-1].query = local_68;
      *(undefined8 *)((long)&pQVar4[-1].value.d.data + 0x10) = aStack_60._16_8_;
      *(undefined1 **)&pQVar4[-1].value.d.field_0x18 = local_48;
      pQVar4[-1].value.d.data.shared = aStack_60.shared;
      *(undefined8 *)((long)&pQVar4[-1].value.d.data + 8) = aStack_60._8_8_;
      aStack_60.shared = (PrivateShared *)0x0;
      aStack_60._8_8_ = 0;
      aStack_60._16_8_ = 0;
      local_48 = (undefined1 *)0x2;
      ppQVar1 = &(this->super_QGenericArrayOps<QInputMethodQueryEvent::QueryPair>).
                 super_QArrayDataPointer<QInputMethodQueryEvent::QueryPair>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
      pqVar2 = &(this->super_QGenericArrayOps<QInputMethodQueryEvent::QueryPair>).
                super_QArrayDataPointer<QInputMethodQueryEvent::QueryPair>.size;
      *pqVar2 = *pqVar2 + 1;
    }
    else {
      pQVar5 = (this->super_QGenericArrayOps<QInputMethodQueryEvent::QueryPair>).
               super_QArrayDataPointer<QInputMethodQueryEvent::QueryPair>.ptr;
      pQVar4 = pQVar5 + i + 1;
      local_90.nInserts = 1;
      local_90.bytes =
           ((this->super_QGenericArrayOps<QInputMethodQueryEvent::QueryPair>).
            super_QArrayDataPointer<QInputMethodQueryEvent::QueryPair>.size - i) * 0x28;
      local_90.data = (QArrayDataPointer<QInputMethodQueryEvent::QueryPair> *)this;
      local_90.displaceTo = pQVar4;
      memmove(pQVar4,pQVar5 + i,local_90.bytes);
      pQVar4[-1].query = local_68;
      *(undefined8 *)((long)&pQVar4[-1].value.d.data + 0x10) = aStack_60._16_8_;
      *(undefined1 **)&pQVar4[-1].value.d.field_0x18 = local_48;
      pQVar4[-1].value.d.data.shared = aStack_60.shared;
      *(undefined8 *)((long)&pQVar4[-1].value.d.data + 8) = aStack_60._8_8_;
      aStack_60.shared = (PrivateShared *)0x0;
      aStack_60._8_8_ = 0;
      aStack_60._16_8_ = 0;
      local_48 = (undefined1 *)0x2;
      local_90.displaceFrom = pQVar4;
      Inserter::~Inserter(&local_90);
    }
    ::QVariant::~QVariant((QVariant *)&aStack_60);
  }
  else {
    if (((this->super_QGenericArrayOps<QInputMethodQueryEvent::QueryPair>).
         super_QArrayDataPointer<QInputMethodQueryEvent::QueryPair>.size == i) &&
       (pQVar4 = (this->super_QGenericArrayOps<QInputMethodQueryEvent::QueryPair>).
                 super_QArrayDataPointer<QInputMethodQueryEvent::QueryPair>.ptr,
       (pDVar3->super_QArrayData).alloc - i !=
       ((long)((long)pQVar4 -
              ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
       -0x3333333333333333)) {
      pQVar4 = pQVar4 + i;
      pQVar4->query = args->query;
      ::QVariant::QVariant(&pQVar4->value,&args->value);
    }
    else {
      if ((i != 0) ||
         (pQVar4 = (this->super_QGenericArrayOps<QInputMethodQueryEvent::QueryPair>).
                   super_QArrayDataPointer<QInputMethodQueryEvent::QueryPair>.ptr,
         (QueryPair *)((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)
         == pQVar4)) goto LAB_002c9c05;
      pQVar4[-1].query = args->query;
      ::QVariant::QVariant(&pQVar4[-1].value,&args->value);
      ppQVar1 = &(this->super_QGenericArrayOps<QInputMethodQueryEvent::QueryPair>).
                 super_QArrayDataPointer<QInputMethodQueryEvent::QueryPair>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    pqVar2 = &(this->super_QGenericArrayOps<QInputMethodQueryEvent::QueryPair>).
              super_QArrayDataPointer<QInputMethodQueryEvent::QueryPair>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }